

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_ds.h
# Opt level: O0

void * stbds_hmget_key_ts(void *a,size_t elemsize,void *key,size_t keysize,ptrdiff_t *temp,int mode)

{
  long lVar1;
  void *__s;
  ulong uVar2;
  stbds_hash_bucket *b;
  ptrdiff_t slot;
  void *raw_a;
  stbds_hash_index *table;
  size_t keyoffset;
  int mode_local;
  ptrdiff_t *temp_local;
  size_t keysize_local;
  void *key_local;
  size_t elemsize_local;
  void *a_local;
  
  if (a == (void *)0x0) {
    __s = stbds_arrgrowf((void *)0x0,elemsize,0,1);
    *(long *)((long)__s + -0x20) = *(long *)((long)__s + -0x20) + 1;
    memset(__s,0,elemsize);
    *temp = -1;
    a_local = (void *)((long)__s + elemsize);
  }
  else {
    lVar1 = *(long *)((long)a + (-0x10 - elemsize));
    a_local = a;
    if (lVar1 == 0) {
      *temp = -1;
    }
    else {
      uVar2 = stbds_hm_find_slot(a,elemsize,key,keysize,0,mode);
      if ((long)uVar2 < 0) {
        *temp = -1;
      }
      else {
        *temp = *(ptrdiff_t *)
                 (*(long *)(lVar1 + 0x60) + ((long)uVar2 >> 3) * 0x80 + 0x40 + (uVar2 & 7) * 8);
      }
    }
  }
  return a_local;
}

Assistant:

void * stbds_hmget_key_ts(void *a, size_t elemsize, void *key, size_t keysize, ptrdiff_t *temp, int mode)
{
  size_t keyoffset = 0;
  if (a == NULL) {
    // make it non-empty so we can return a temp
    a = stbds_arrgrowf(0, elemsize, 0, 1);
    stbds_header(a)->length += 1;
    memset(a, 0, elemsize);
    *temp = STBDS_INDEX_EMPTY;
    // adjust a to point after the default element
    return STBDS_ARR_TO_HASH(a,elemsize);
  } else {
    stbds_hash_index *table;
    void *raw_a = STBDS_HASH_TO_ARR(a,elemsize);
    // adjust a to point to the default element
    table = (stbds_hash_index *) stbds_header(raw_a)->hash_table;
    if (table == 0) {
      *temp = -1;
    } else {
      ptrdiff_t slot = stbds_hm_find_slot(a, elemsize, key, keysize, keyoffset, mode);
      if (slot < 0) {
        *temp = STBDS_INDEX_EMPTY;
      } else {
        stbds_hash_bucket *b = &table->storage[slot >> STBDS_BUCKET_SHIFT];
        *temp = b->index[slot & STBDS_BUCKET_MASK];
      }
    }
    return a;
  }
}